

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

BOOL SetCurrentDirectoryA(LPCSTR lpPathName)

{
  BOOL BVar1;
  int iVar2;
  size_t sVar3;
  char *lpPath;
  int *piVar4;
  DWORD dwErrCode;
  BOOL BVar5;
  undefined1 local_b8 [8];
  stat stat_data;
  DWORD dwLastError;
  
  stat_data.__glibc_reserved[2]._4_4_ = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0014befa;
  if (lpPathName == (LPCSTR)0x0) {
    stat_data.__glibc_reserved[2]._4_4_ = 0x7b;
    dwErrCode = 0x7b;
LAB_0014be91:
    lpPath = (char *)0x0;
LAB_0014be93:
    SetLastError(dwErrCode);
    BVar5 = 0;
    BVar1 = 0;
    if (lpPath != (char *)0x0) goto LAB_0014bea0;
  }
  else {
    sVar3 = strlen(lpPathName);
    if (0x3ff < sVar3) {
      stat_data.__glibc_reserved[2]._4_4_ = 0xce;
      dwErrCode = 0xce;
      goto LAB_0014be91;
    }
    lpPath = PAL__strdup(lpPathName);
    if (lpPath == (char *)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0014befa;
      stat_data.__glibc_reserved[2]._4_4_ = 8;
      dwErrCode = 8;
      goto LAB_0014be91;
    }
    FILEDosToUnixPathA(lpPath);
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0014befa;
    iVar2 = chdir(lpPath);
    if (iVar2 != 0) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      if ((iVar2 == 0x14) || (iVar2 == 2)) {
        iVar2 = stat64(lpPath,(stat64 *)local_b8);
        if ((iVar2 == 0) && (((uint)stat_data.st_nlink & 0xf000) == 0x8000)) {
          stat_data.__glibc_reserved[2]._4_4_ = 0x10b;
        }
        else {
          FILEGetProperNotFoundError(lpPath,(LPDWORD)((long)stat_data.__glibc_reserved + 0x14));
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0014befa;
        dwErrCode = stat_data.__glibc_reserved[2]._4_4_;
        if (stat_data.__glibc_reserved[2]._4_4_ == 0) {
          BVar1 = 0;
          goto LAB_0014bea0;
        }
      }
      else {
        stat_data.__glibc_reserved[2]._4_4_ = 5;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0014befa;
        strerror(iVar2);
        dwErrCode = 5;
      }
      goto LAB_0014be93;
    }
    BVar1 = 1;
LAB_0014bea0:
    BVar5 = BVar1;
    PAL_free(lpPath);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return BVar5;
  }
LAB_0014befa:
  abort();
}

Assistant:

BOOL
PALAPI
SetCurrentDirectoryA(
            IN LPCSTR lpPathName)
{
    BOOL bRet = FALSE;
    DWORD dwLastError = 0;
    int result;
    LPSTR UnixPathName = NULL;

    PERF_ENTRY(SetCurrentDirectoryA);
    ENTRY("SetCurrentDirectoryA(lpPathName=%p (%s))\n",
          lpPathName?lpPathName:"NULL",
          lpPathName?lpPathName:"NULL");

   /*check if the given path is null. If so
     return FALSE*/
    if (lpPathName == NULL )
    {
        ERROR("Invalid path/directory name\n");
        dwLastError = ERROR_INVALID_NAME;
        goto done;
    }
    if (strlen(lpPathName) >= MAX_LONGPATH)
    {
        WARN("Path/directory name longer than MAX_LONGPATH characters\n");
        dwLastError = ERROR_FILENAME_EXCED_RANGE;
        goto done;
    }

    UnixPathName = PAL__strdup(lpPathName);
    if (UnixPathName == NULL )
    {
        ERROR("PAL__strdup() failed\n");
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    FILEDosToUnixPathA( UnixPathName );

    TRACE("Attempting to open Unix dir [%s]\n", UnixPathName);
    result = chdir(UnixPathName);

    if ( result == 0 )
    {
        bRet = TRUE;
    }
    else
    {
        if ( errno == ENOTDIR || errno == ENOENT )
        {
            struct stat stat_data;

            if ( stat( UnixPathName, &stat_data) == 0 &&
                 (stat_data.st_mode & S_IFMT) == S_IFREG )
            {
                /* Not a directory, it is a file. */
                dwLastError = ERROR_DIRECTORY;
            }
            else
            {
                FILEGetProperNotFoundError( UnixPathName, &dwLastError );
            }
            TRACE("chdir() failed, path was invalid.\n");
        }
        else
        {
            dwLastError = ERROR_ACCESS_DENIED;
            ERROR("chdir() failed; errno is %d (%s)\n", errno, strerror(errno));
        }
    }


done:
    if( dwLastError )
    {
        SetLastError(dwLastError);
    }

    if(UnixPathName != NULL)
    {
        PAL_free( UnixPathName );
    }

    LOGEXIT("SetCurrentDirectoryA returns BOOL %d\n", bRet);
    PERF_EXIT(SetCurrentDirectoryA);
    return bRet;
}